

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::TransformFeedback::ProgramSpec::addTransformFeedbackVarying
          (ProgramSpec *this,char *name)

{
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,name,&local_31);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->m_transformFeedbackVaryings,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void ProgramSpec::addTransformFeedbackVarying (const char* name)
{
	m_transformFeedbackVaryings.push_back(name);
}